

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microfmt.hpp
# Opt level: O1

void cpptrace::microfmt::detail::do_write<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
               (string *out,
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     end,format_options *options)

{
  size_type __pos;
  size_t __n;
  pointer pcVar1;
  ptrdiff_t _Num;
  ulong __n2;
  pointer __s;
  
  __n2 = (long)end._M_current - (long)begin._M_current;
  __pos = out->_M_string_length;
  if (options->width <= __n2) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              (out,__pos,0,begin._M_current,__n2);
    return;
  }
  std::__cxx11::string::resize((ulong)out,(char)options->width + (char)__pos);
  if (options->align == left) {
    if (end._M_current != begin._M_current) {
      memmove((out->_M_dataplus)._M_p + __pos,begin._M_current,__n2);
    }
    pcVar1 = (out->_M_dataplus)._M_p;
    __s = pcVar1 + __n2 + __pos;
    pcVar1 = pcVar1 + (out->_M_string_length - (long)__s);
    if (pcVar1 != (pointer)0x0) {
      memset(__s,*(int *)&options->fill,(size_t)pcVar1);
      return;
    }
  }
  else {
    __n = options->width - __n2;
    if (__n != 0) {
      memset((out->_M_dataplus)._M_p + __pos,*(int *)&options->fill,__n);
    }
    if (end._M_current != begin._M_current) {
      memmove((out->_M_dataplus)._M_p + (options->width - __n2) + __pos,begin._M_current,__n2);
      return;
    }
  }
  return;
}

Assistant:

void do_write(std::string& out, It begin, It end, const format_options& options) {
            auto size = end - begin;
            if(static_cast<std::size_t>(size) >= options.width) {
                out.append(begin, end);
            } else {
                auto out_size = out.size();
                out.resize(out_size + options.width);
                if(options.align == alignment::left) {
                    std::copy(begin, end, out.begin() + out_size);
                    std::fill(out.begin() + out_size + size, out.end(), options.fill);
                } else {
                    std::fill(out.begin() + out_size, out.begin() + out_size + (options.width - size), options.fill);
                    std::copy(begin, end, out.begin() + out_size + (options.width - size));
                }
            }
        }